

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

QScroller * QScroller::scroller(QObject *target)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QScroller *s;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
  *in_stack_ffffffffffffff98;
  QScroller **in_stack_ffffffffffffffa0;
  QObject **in_stack_ffffffffffffffa8;
  QScroller *key;
  QScroller *in_stack_ffffffffffffffb0;
  QScroller *local_48;
  char local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
               (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(char *)in_stack_ffffffffffffff98);
    QMessageLogger::warning(local_30,"QScroller::scroller() was called with a null target.");
    local_48 = (QScroller *)0x0;
  }
  else {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>::operator()
              (in_stack_ffffffffffffff98);
    bVar1 = QMap<QObject_*,_QScroller_*>::contains
                      ((QMap<QObject_*,_QScroller_*> *)in_stack_ffffffffffffffb0,
                       in_stack_ffffffffffffffa8);
    if (bVar1) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>::
      operator()(in_stack_ffffffffffffff98);
      local_48 = QMap<QObject_*,_QScroller_*>::value
                           ((QMap<QObject_*,_QScroller_*> *)in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    else {
      local_48 = (QScroller *)operator_new(0x18);
      QScroller(in_stack_ffffffffffffffb0,(QObject *)local_48);
      key = local_48;
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>::
      operator()(in_stack_ffffffffffffff98);
      QMap<QObject_*,_QScroller_*>::insert
                ((QMap<QObject_*,_QScroller_*> *)in_stack_ffffffffffffffb0,(QObject **)key,
                 in_stack_ffffffffffffffa0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

QScroller *QScroller::scroller(QObject *target)
{
    if (!target) {
        qWarning("QScroller::scroller() was called with a null target.");
        return nullptr;
    }

    if (qt_allScrollers()->contains(target))
        return qt_allScrollers()->value(target);

    QScroller *s = new QScroller(target);
    qt_allScrollers()->insert(target, s);
    return s;
}